

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall
asmjit::CodeHolder::newNamedLabelId
          (CodeHolder *this,uint32_t *idOut,char *name,size_t nameLength,uint32_t type,
          uint32_t parentId)

{
  ZoneHeap *heap;
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  Error EVar5;
  ZoneHashNode *pZVar6;
  undefined4 extraout_var;
  uint32_t uVar7;
  ZoneHashNode *__s1;
  uint uVar8;
  uint local_50;
  ulong local_40;
  size_t local_38;
  
  *idOut = 0;
  local_40 = nameLength;
  local_50 = anon_unknown_32::CodeHolder_hashNameAndFixLen(name,&local_40);
  uVar3 = local_40;
  if (local_40 == 0) {
    EVar5 = 0x11;
  }
  else if (local_40 < 0x801) {
    if (type == 2) {
      if (parentId != 0) {
        return 0x13;
      }
    }
    else {
      if (type != 1) {
        return 3;
      }
      if ((this->_labels).super_ZoneVectorBase._length <= (ulong)(parentId - 0x100)) {
        return 0x12;
      }
      local_50 = local_50 ^ parentId;
    }
    pZVar6 = *(this->_namedLabels).super_ZoneHashBase._data;
    while( true ) {
      uVar8 = (uint)uVar3;
      if (pZVar6 == (ZoneHashNode *)0x0) break;
      if (*(uint *)(pZVar6 + 0x30) == uVar8) {
        if (*(uint *)(pZVar6 + 0x30) < 0xc) {
          __s1 = pZVar6 + 0x34;
        }
        else {
          __s1 = *(ZoneHashNode **)(pZVar6 + 0x38);
        }
        iVar4 = bcmp(__s1,name,uVar3);
        if (iVar4 == 0) {
          if (pZVar6 != (ZoneHashNode *)0x0) {
            return 0xf;
          }
          break;
        }
      }
      pZVar6 = *(ZoneHashNode **)pZVar6;
    }
    uVar2 = (this->_labels).super_ZoneVectorBase._length;
    if (uVar2 >> 8 < 0xffffff) {
      heap = &this->_baseHeap;
      EVar5 = 0;
      if ((this->_labels).super_ZoneVectorBase._capacity == uVar2) {
        EVar5 = ZoneVectorBase::_grow(&(this->_labels).super_ZoneVectorBase,heap,8,1);
      }
      if (EVar5 == 0) {
        if (heap->_zone == (Zone *)0x0) {
          newNamedLabelId();
        }
        else {
          pZVar6 = (ZoneHashNode *)ZoneHeap::_allocZeroed(heap,0x40,&local_38);
          if (pZVar6 != (ZoneHashNode *)0x0) {
            uVar7 = (int)uVar2 + 0x100;
            *(uint *)(pZVar6 + 8) = local_50;
            *(uint32_t *)(pZVar6 + 0xc) = uVar7;
            pZVar6[0x10] = SUB41(type,0);
            *(undefined8 *)(pZVar6 + 0x14) = 0xffffffff00000000;
            *(undefined8 *)(pZVar6 + 0x20) = 0;
            if (uVar3 < 0xc) {
              *(uint *)(pZVar6 + 0x30) = uVar8;
              memcpy(pZVar6 + 0x34,name,uVar3);
              pZVar6[uVar3 + 0x34] = (ZoneHashNode)0x0;
            }
            else {
              iVar4 = Zone::dup(&this->_dataZone,(int)name);
              if (CONCAT44(extraout_var,iVar4) == 0) {
                return 1;
              }
              *(uint *)(pZVar6 + 0x30) = uVar8;
              *(long *)(pZVar6 + 0x38) = CONCAT44(extraout_var,iVar4);
            }
            uVar3 = (this->_labels).super_ZoneVectorBase._length;
            if ((this->_labels).super_ZoneVectorBase._capacity <= uVar3) {
              newNamedLabelId();
              return 0xf;
            }
            *(ZoneHashNode **)((long)(this->_labels).super_ZoneVectorBase._data + uVar3 * 8) =
                 pZVar6;
            psVar1 = &(this->_labels).super_ZoneVectorBase._length;
            *psVar1 = *psVar1 + 1;
            ZoneHashBase::_put(&(this->_namedLabels).super_ZoneHashBase,pZVar6);
            *idOut = uVar7;
            return 0;
          }
        }
        EVar5 = 1;
      }
    }
    else {
      EVar5 = 0xd;
    }
  }
  else {
    EVar5 = 0x10;
  }
  return EVar5;
}

Assistant:

Error CodeHolder::newNamedLabelId(uint32_t& idOut, const char* name, size_t nameLength, uint32_t type, uint32_t parentId) noexcept {
  idOut = 0;
  uint32_t hVal = CodeHolder_hashNameAndFixLen(name, nameLength);

  if (ASMJIT_UNLIKELY(nameLength == 0))
    return DebugUtils::errored(kErrorInvalidLabelName);

  if (ASMJIT_UNLIKELY(nameLength > Globals::kMaxLabelLength))
    return DebugUtils::errored(kErrorLabelNameTooLong);

  switch (type) {
    case Label::kTypeLocal:
      if (ASMJIT_UNLIKELY(Operand::unpackId(parentId) >= _labels.getLength()))
        return DebugUtils::errored(kErrorInvalidParentLabel);

      hVal ^= parentId;
      break;

    case Label::kTypeGlobal:
      if (ASMJIT_UNLIKELY(parentId != 0))
        return DebugUtils::errored(kErrorNonLocalLabelCantHaveParent);

      break;

    default:
      return DebugUtils::errored(kErrorInvalidArgument);
  }

  // Don't allow to insert duplicates. Local labels allow duplicates that have
  // different id, this is already accomplished by having a different hashes
  // between the same label names having different parent labels.
  LabelEntry* le = _namedLabels.get(LabelByName(name, nameLength, hVal));
  if (ASMJIT_UNLIKELY(le))
    return DebugUtils::errored(kErrorLabelAlreadyDefined);

  Error err = kErrorOk;
  size_t index = _labels.getLength();

  if (ASMJIT_UNLIKELY(index >= Operand::kPackedIdCount))
    return DebugUtils::errored(kErrorLabelIndexOverflow);

  ASMJIT_PROPAGATE(_labels.willGrow(&_baseHeap));
  le = _baseHeap.allocZeroedT<LabelEntry>();

  if (ASMJIT_UNLIKELY(!le))
    return  DebugUtils::errored(kErrorNoHeapMemory);

  uint32_t id = Operand::packId(static_cast<uint32_t>(index));
  le->_hVal = hVal;
  le->_setId(id);
  le->_type = static_cast<uint8_t>(type);
  le->_parentId = 0;
  le->_sectionId = SectionEntry::kInvalidId;
  le->_offset = 0;

  if (le->_name.mustEmbed(nameLength)) {
    le->_name.setEmbedded(name, nameLength);
  }
  else {
    char* nameExternal = static_cast<char*>(_dataZone.dup(name, nameLength, true));
    if (ASMJIT_UNLIKELY(!nameExternal))
      return DebugUtils::errored(kErrorNoHeapMemory);
    le->_name.setExternal(nameExternal, nameLength);
  }

  _labels.appendUnsafe(le);
  _namedLabels.put(le);

  idOut = id;
  return err;
}